

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImDrawCmd_resize(ImVector_ImDrawCmd *self,int new_size)

{
  int new_size_local;
  ImVector_ImDrawCmd *self_local;
  
  ImVector<ImDrawCmd>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawCmd_resize(ImVector_ImDrawCmd* self,int new_size)
{
    return self->resize(new_size);
}